

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dxil_resources.cpp
# Opt level: O2

Id dxil_spv::build_load_buffer_offset
             (Impl *impl,ResourceReference *reference,ResourceMeta *meta,Id offset_ssbo_id,
             Id bindless_offset_id,bool non_uniform)

{
  RawVecSize RVar1;
  Id IVar2;
  Id pointee;
  uint uVar3;
  Builder *this;
  Operation *pOVar4;
  Operation *this_00;
  uint u;
  undefined3 in_register_00000089;
  bool bVar5;
  bool bVar6;
  Id const_2 [2];
  
  this = Converter::Impl::builder(impl);
  if (CONCAT31(in_register_00000089,non_uniform) == 0) {
    IVar2 = spv::Builder::makeUintType(this,0x20);
    pOVar4 = Converter::Impl::allocate(impl,OpGroupNonUniformBroadcastFirst,IVar2);
    IVar2 = spv::Builder::makeUintConstant(this,3,false);
    Operation::add_id(pOVar4,IVar2);
    Operation::add_id(pOVar4,bindless_offset_id);
    Converter::Impl::add(impl,pOVar4,false);
    bindless_offset_id = pOVar4->id;
    spv::Builder::addCapability(this,CapabilityGroupNonUniformBallot);
  }
  bVar5 = meta->storage == StorageClassUniformConstant;
  bVar6 = meta->kind == TypedBuffer;
  uVar3 = (&(impl->options).offset_buffer_layout.untyped_offset)[bVar6 || bVar5];
  if ((impl->options).offset_buffer_layout.stride != 1) {
    IVar2 = spv::Builder::makeUintType(this,0x20);
    pOVar4 = Converter::Impl::allocate(impl,OpIMul,IVar2);
    Operation::add_id(pOVar4,bindless_offset_id);
    IVar2 = spv::Builder::makeUintConstant(this,(impl->options).offset_buffer_layout.stride,false);
    Operation::add_id(pOVar4,IVar2);
    Converter::Impl::add(impl,pOVar4,false);
    bindless_offset_id = pOVar4->id;
  }
  if (uVar3 != 0) {
    IVar2 = spv::Builder::makeUintType(this,0x20);
    pOVar4 = Converter::Impl::allocate(impl,OpIAdd,IVar2);
    Operation::add_id(pOVar4,bindless_offset_id);
    IVar2 = spv::Builder::makeUintConstant(this,uVar3,false);
    Operation::add_id(pOVar4,IVar2);
    Converter::Impl::add(impl,pOVar4,false);
    bindless_offset_id = pOVar4->id;
  }
  IVar2 = spv::Builder::makeUintType(this,0x20);
  pointee = spv::Builder::makeVectorType(this,IVar2,2);
  IVar2 = spv::Builder::makePointer(this,StorageClassStorageBuffer,pointee);
  pOVar4 = Converter::Impl::allocate(impl,OpAccessChain,IVar2);
  Operation::add_id(pOVar4,offset_ssbo_id);
  IVar2 = spv::Builder::makeUintConstant(this,0,false);
  Operation::add_id(pOVar4,IVar2);
  Operation::add_id(pOVar4,bindless_offset_id);
  Converter::Impl::add(impl,pOVar4,false);
  this_00 = Converter::Impl::allocate(impl,OpLoad,pointee);
  Operation::add_id(this_00,pOVar4->id);
  Converter::Impl::add(impl,this_00,false);
  IVar2 = this_00->id;
  if ((!bVar6 && !bVar5) && (reference->aliased == false)) {
    pOVar4 = Converter::Impl::allocate(impl,OpShiftRightLogical,pointee);
    Operation::add_id(pOVar4,IVar2);
    RVar1 = meta->raw_component_vecsize;
    uVar3 = raw_component_type_to_bits(meta->component_type);
    u = 0;
    for (uVar3 = uVar3 * (RVar1 + V2) >> 3; 1 < uVar3; uVar3 = uVar3 >> 1) {
      u = u + 1;
    }
    const_2[0] = spv::Builder::makeUintConstant(this,u,false);
    const_2[1] = const_2[0];
    IVar2 = spv::Builder::makeUintType(this,0x20);
    IVar2 = Converter::Impl::build_constant_vector(impl,IVar2,const_2,2);
    Operation::add_id(pOVar4,IVar2);
    Converter::Impl::add(impl,pOVar4,false);
    IVar2 = pOVar4->id;
  }
  return IVar2;
}

Assistant:

static spv::Id build_load_buffer_offset(Converter::Impl &impl, Converter::Impl::ResourceReference &reference,
                                        Converter::Impl::ResourceMeta &meta,
                                        spv::Id offset_ssbo_id, spv::Id bindless_offset_id, bool non_uniform)
{
	auto &builder = impl.builder();

	if (!non_uniform)
	{
		// Allow scalar load of the offset if possible.
		Operation *scalar_op = impl.allocate(spv::OpGroupNonUniformBroadcastFirst, builder.makeUintType(32));
		scalar_op->add_id(builder.makeUintConstant(spv::ScopeSubgroup));
		scalar_op->add_id(bindless_offset_id);
		impl.add(scalar_op);
		bindless_offset_id = scalar_op->id;
		builder.addCapability(spv::CapabilityGroupNonUniformBallot);
	}

	bool untyped_buffer = meta.storage != spv::StorageClassUniformConstant &&
	                      meta.kind != DXIL::ResourceKind::TypedBuffer;
	unsigned layout_offset = untyped_buffer ? impl.options.offset_buffer_layout.untyped_offset :
	                         impl.options.offset_buffer_layout.typed_offset;

	if (impl.options.offset_buffer_layout.stride != 1)
	{
		Operation *scale_op = impl.allocate(spv::OpIMul, builder.makeUintType(32));
		scale_op->add_id(bindless_offset_id);
		scale_op->add_id(builder.makeUintConstant(impl.options.offset_buffer_layout.stride));
		impl.add(scale_op);
		bindless_offset_id = scale_op->id;
	}

	if (layout_offset)
	{
		Operation *bias_op = impl.allocate(spv::OpIAdd, builder.makeUintType(32));
		bias_op->add_id(bindless_offset_id);
		bias_op->add_id(builder.makeUintConstant(layout_offset));
		impl.add(bias_op);
		bindless_offset_id = bias_op->id;
	}

	spv::Id vec_type = builder.makeVectorType(builder.makeUintType(32), 2);

	Operation *chain_op = impl.allocate(spv::OpAccessChain,
	                                    builder.makePointer(spv::StorageClassStorageBuffer,
	                                                        vec_type));
	chain_op->add_id(offset_ssbo_id);
	chain_op->add_id(builder.makeUintConstant(0));
	chain_op->add_id(bindless_offset_id);
	impl.add(chain_op);

	Operation *load_op = impl.allocate(spv::OpLoad, vec_type);
	load_op->add_id(chain_op->id);
	impl.add(load_op);

	spv::Id offset_id = load_op->id;

	// Shift the offset buffer once if we can get away with it.
	if (untyped_buffer && !reference.aliased)
	{
		Operation *shift_op = impl.allocate(spv::OpShiftRightLogical, vec_type);
		shift_op->add_id(offset_id);

		unsigned ssbo_element_size =
			raw_vecsize_to_vecsize(meta.raw_component_vecsize) *
			raw_component_type_to_bits(meta.component_type) / 8;

		unsigned shamt = 0;
		while (ssbo_element_size > 1)
		{
			shamt++;
			ssbo_element_size >>= 1;
		}

		spv::Id const_2[2];
		const_2[0] = const_2[1] = builder.makeUintConstant(shamt);
		spv::Id const_vec = impl.build_constant_vector(builder.makeUintType(32), const_2, 2);

		shift_op->add_id(const_vec);
		impl.add(shift_op);

		offset_id = shift_op->id;
	}

	return offset_id;
}